

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall
embree::MetalMaterial::MetalMaterial(MetalMaterial *this,Vec3fa *reflectance,Vec3fa *eta,Vec3fa *k)

{
  undefined8 uVar1;
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002a7198;
  (this->base).type = 8;
  uVar1 = *(undefined8 *)((long)&reflectance->field_0 + 8);
  *(undefined8 *)&(this->reflectance).field_0 = *(undefined8 *)&reflectance->field_0;
  *(undefined8 *)((long)&(this->reflectance).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&eta->field_0 + 8);
  *(undefined8 *)&(this->eta).field_0 = *(undefined8 *)&eta->field_0;
  *(undefined8 *)((long)&(this->eta).field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&k->field_0 + 8);
  *(undefined8 *)&(this->k).field_0 = *(undefined8 *)&k->field_0;
  *(undefined8 *)((long)&(this->k).field_0 + 8) = uVar1;
  this->roughness = 0.0;
  return;
}

Assistant:

MetalMaterial (const Vec3fa& reflectance, const Vec3fa& eta, const Vec3fa& k)
      : base(MATERIAL_REFLECTIVE_METAL), reflectance(reflectance), eta(eta), k(k), roughness(0.0f) {}